

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  uchar *puVar1;
  ushort uVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  size_t sVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  uint *bitlen;
  uint *puVar11;
  uint *puVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  size_t sVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ucvector *puVar26;
  HuffmanTree tree_ll;
  uint local_124;
  LodePNGBitReader local_120;
  ucvector *local_f8;
  uint local_f0;
  uint local_ec;
  uint *local_e8;
  uint *local_e0;
  uint local_d8;
  uint local_d4;
  ulong local_d0;
  LodePNGDecompressSettings *local_c8;
  size_t local_c0;
  HuffmanTree local_b8;
  HuffmanTree local_88;
  HuffmanTree local_58;
  
  local_120.bitsize = insize * 8;
  local_ec = 0x69;
  if (local_120.bitsize < 0xffffffffffffffc0 && insize >> 0x3d == 0) {
    local_120.bp = 0;
    local_ec = 0;
    local_f0 = 0;
    local_124 = 0;
    local_120.data = in;
    local_120.size = insize;
    local_f8 = out;
    local_c8 = settings;
    do {
      sVar3 = local_120.size;
      if (local_f0 != 0) goto LAB_001df71b;
      cVar8 = '\x01';
      if (local_120.bitsize - local_120.bp < 3) {
        local_ec = 0x34;
      }
      else {
        uVar17 = local_120.bp >> 3;
        if (uVar17 + 1 < local_120.size) {
          local_120.buffer = (uint)*(ushort *)(local_120.data + uVar17);
        }
        else {
          local_120.buffer = 0;
          if (uVar17 < local_120.size) {
            local_120.buffer = (uint)local_120.data[uVar17];
          }
        }
        local_120.buffer = local_120.buffer >> ((byte)local_120.bp & 7);
        local_f0 = local_120.buffer & 1;
        uVar20 = local_120.buffer >> 1 & 3;
        local_120.buffer = local_120.buffer >> 3;
        uVar17 = local_120.bp + 3;
        if (uVar20 == 3) {
          local_ec = 0x14;
          local_120.bp = uVar17;
        }
        else {
          if (uVar20 == 0) {
            uVar19 = local_120.bp + 10 >> 3;
            uVar21 = uVar19 + 4;
            local_124 = 0x34;
            local_120.bp = uVar17;
            if (uVar21 < local_120.size) {
              uVar2 = *(ushort *)(local_120.data + uVar19);
              uVar13 = (ulong)uVar2;
              if ((settings->ignore_nlen != 0) ||
                 (local_124 = 0x15,
                 (uint)*(ushort *)(local_120.data + uVar19 + 2) + (uint)uVar2 == 0xffff)) {
                sVar22 = local_f8->size + uVar13;
                local_f8->size = sVar22;
                uVar20 = ucvector_reserve(local_f8,sVar22);
                if (uVar20 == 0) {
                  local_124 = 0x53;
                }
                else {
                  local_124 = 0x17;
                  if (uVar21 + uVar13 <= sVar3) {
                    if (uVar2 != 0) {
                      memcpy(local_f8->data + (local_f8->size - uVar13),local_120.data + uVar21,
                             uVar13);
                      uVar21 = uVar21 + uVar13;
                    }
                    local_120.bp = uVar21 << 3;
                    local_124 = 0;
                  }
                }
              }
            }
          }
          else {
            sVar3 = settings->max_output_size;
            local_120.bp = uVar17;
            uVar9 = ucvector_reserve(out,out->size + 0x104);
            sVar7 = local_120.bitsize;
            sVar22 = local_120.size;
            if (uVar9 == 0) {
              local_124 = 0x53;
              settings = local_c8;
            }
            else {
              local_88.codes = (uint *)0x0;
              local_88.lengths = (uint *)0x0;
              local_88.table_len = (uchar *)0x0;
              local_88.table_value = (unsigned_short *)0x0;
              local_b8.codes = (uint *)0x0;
              local_b8.lengths = (uint *)0x0;
              local_b8.table_len = (uchar *)0x0;
              local_b8.table_value = (unsigned_short *)0x0;
              local_c0 = sVar3;
              if (uVar20 == 1) {
                local_124 = generateFixedLitLenTree(&local_88);
                if (local_124 == 0) {
                  local_124 = generateFixedDistanceTree(&local_b8);
                }
              }
              else {
                local_124 = 0x31;
                if (0xd < local_120.bitsize - local_120.bp) {
                  uVar17 = local_120.bp >> 3;
                  if (uVar17 + 2 < local_120.size) {
                    local_120.buffer =
                         (uint)CONCAT12(local_120.data[uVar17 + 2],
                                        *(undefined2 *)(local_120.data + uVar17));
                  }
                  else {
                    local_120.buffer = 0;
                    if (uVar17 < local_120.size) {
                      local_120.buffer = (uint)local_120.data[uVar17];
                    }
                    if (uVar17 + 1 < local_120.size) {
                      local_120.buffer = local_120.buffer | (uint)local_120.data[uVar17 + 1] << 8;
                    }
                  }
                  uVar20 = local_120.buffer >> ((byte)local_120.bp & 7);
                  local_120.buffer = uVar20 >> 0xe;
                  uVar17 = local_120.bp + 0xe;
                  local_120.bp = uVar17;
                  bitlen = (uint *)malloc(0x4c);
                  if (bitlen == (uint *)0x0) {
                    local_124 = 0x53;
                    out = local_f8;
                  }
                  else {
                    uVar9 = uVar20 >> 10 & 0xf;
                    uVar21 = (ulong)uVar9;
                    iVar18 = uVar9 + 4;
                    local_58.codes = (uint *)0x0;
                    local_58.lengths = (uint *)0x0;
                    local_58.table_len = (uchar *)0x0;
                    local_58.table_value = (unsigned_short *)0x0;
                    uVar19 = (uint)(iVar18 * 3) + uVar17;
                    if (sVar7 < uVar19 || uVar19 < uVar17) {
                      local_124 = 0x32;
LAB_001dee1c:
                      puVar11 = (uint *)0x0;
                      puVar12 = (uint *)0x0;
                      out = local_f8;
                    }
                    else {
                      uVar9 = uVar20 & 0x1f;
                      local_d8 = uVar9 + 0x101;
                      lVar23 = 0;
                      do {
                        uVar19 = uVar17 >> 3;
                        if (uVar19 + 1 < sVar22) {
                          uVar10 = (uint)*(ushort *)(local_120.data + uVar19);
                        }
                        else {
                          uVar10 = 0;
                          if (uVar19 < sVar22) {
                            uVar10 = (uint)local_120.data[uVar19];
                          }
                        }
                        uVar10 = uVar10 >> ((byte)uVar17 & 7);
                        local_120.buffer = uVar10 >> 3;
                        uVar17 = uVar17 + 3;
                        bitlen[*(uint *)((long)CLCL_ORDER + lVar23)] = uVar10 & 7;
                        lVar23 = lVar23 + 4;
                      } while (uVar21 * 4 + 0x10 != lVar23);
                      if (iVar18 != 0x13) {
                        do {
                          bitlen[CLCL_ORDER[uVar21 + 4]] = 0;
                          uVar21 = uVar21 + 1;
                        } while (uVar21 != 0xf);
                      }
                      local_120.bp = uVar17;
                      local_124 = HuffmanTree_makeFromLengths(&local_58,bitlen,0x13,7);
                      if (local_124 != 0) goto LAB_001dee1c;
                      puVar11 = (uint *)malloc(0x480);
                      puVar12 = (uint *)malloc(0x80);
                      local_124 = 0x53;
                      out = local_f8;
                      if (puVar12 != (uint *)0x0 && puVar11 != (uint *)0x0) {
                        local_124 = 0;
                        local_e8 = puVar11;
                        memset(puVar11,0,0x480);
                        puVar12[0] = 0;
                        puVar12[1] = 0;
                        puVar12[2] = 0;
                        puVar12[3] = 0;
                        puVar12[4] = 0;
                        puVar12[5] = 0;
                        puVar12[6] = 0;
                        puVar12[7] = 0;
                        puVar12[8] = 0;
                        puVar12[9] = 0;
                        puVar12[10] = 0;
                        puVar12[0xb] = 0;
                        puVar12[0xc] = 0;
                        puVar12[0xd] = 0;
                        puVar12[0xe] = 0;
                        puVar12[0xf] = 0;
                        puVar12[0x10] = 0;
                        puVar12[0x11] = 0;
                        puVar12[0x12] = 0;
                        puVar12[0x13] = 0;
                        puVar12[0x14] = 0;
                        puVar12[0x15] = 0;
                        puVar12[0x16] = 0;
                        puVar12[0x17] = 0;
                        puVar12[0x18] = 0;
                        puVar12[0x19] = 0;
                        puVar12[0x1a] = 0;
                        puVar12[0x1b] = 0;
                        puVar12[0x1c] = 0;
                        puVar12[0x1d] = 0;
                        puVar12[0x1e] = 0;
                        puVar12[0x1f] = 0;
                        uVar20 = (uVar20 >> 5 & 0x1f) + 1 + local_d8;
                        uVar19 = (ulong)uVar20;
                        local_d4 = uVar9 + 0x102;
                        uVar21 = (ulong)local_d8;
                        local_d0 = (ulong)-uVar9;
                        iVar18 = -uVar9 - 0x101;
                        uVar17 = 0;
                        local_e0 = puVar12;
                        do {
                          uVar9 = (uint)uVar17;
                          if (uVar20 <= uVar9) break;
                          uVar13 = local_120.bp >> 3;
                          if (uVar13 + 3 < local_120.size) {
                            local_120.buffer = *(uint *)(local_120.data + uVar13);
                          }
                          else {
                            local_120.buffer = 0;
                            if (uVar13 < local_120.size) {
                              local_120.buffer = (uint)local_120.data[uVar13];
                            }
                            if (uVar13 + 1 < local_120.size) {
                              local_120.buffer =
                                   local_120.buffer | (uint)local_120.data[uVar13 + 1] << 8;
                            }
                            if (uVar13 + 2 < local_120.size) {
                              local_120.buffer =
                                   local_120.buffer | (uint)local_120.data[uVar13 + 2] << 0x10;
                            }
                          }
                          local_120.buffer = local_120.buffer >> ((byte)local_120.bp & 7);
                          uVar10 = huffmanDecodeSymbol(&local_120,&local_58);
                          if (uVar10 < 0x10) {
                            puVar11 = local_e0;
                            uVar15 = local_d8;
                            if (uVar9 < local_d8) {
                              uVar15 = 0;
                              puVar11 = local_e8;
                            }
                            puVar11[uVar9 - uVar15] = uVar10;
                            uVar17 = (ulong)(uVar9 + 1);
LAB_001df4c1:
                            if (local_120.bitsize < local_120.bp) {
                              local_124 = 0x32;
                            }
                            iVar16 = 0;
                            if (local_120.bitsize < local_120.bp) {
                              iVar16 = 0xb;
                            }
                          }
                          else {
                            if (uVar10 == 0x12) {
                              uVar9 = local_120.buffer >> 7;
                              local_120.bp = local_120.bp + 7;
                              uVar17 = uVar17 & 0xffffffff;
                              puVar11 = local_e8 + uVar17;
                              iVar16 = (local_120.buffer & 0x7f) + 0xb;
                              do {
                                local_120.buffer = uVar9;
                                if (uVar19 <= uVar17) {
                                  local_124 = 0xf;
                                  break;
                                }
                                puVar12 = local_e0 + (uint)((int)uVar17 + iVar18);
                                if (uVar17 < uVar21) {
                                  puVar12 = puVar11;
                                }
                                *puVar12 = 0;
                                uVar17 = uVar17 + 1;
                                puVar11 = puVar11 + 1;
                                iVar16 = iVar16 + -1;
                              } while (iVar16 != 0);
                              goto LAB_001df4c1;
                            }
                            if (uVar10 == 0x11) {
                              uVar9 = local_120.buffer >> 3;
                              local_120.bp = local_120.bp + 3;
                              uVar17 = uVar17 & 0xffffffff;
                              puVar11 = local_e8 + uVar17;
                              iVar16 = (local_120.buffer & 7) + 3;
                              do {
                                local_120.buffer = uVar9;
                                if (uVar19 <= uVar17) {
                                  local_124 = 0xe;
                                  break;
                                }
                                puVar12 = local_e0 + (uint)((int)uVar17 + iVar18);
                                if (uVar17 < uVar21) {
                                  puVar12 = puVar11;
                                }
                                *puVar12 = 0;
                                uVar17 = uVar17 + 1;
                                puVar11 = puVar11 + 1;
                                iVar16 = iVar16 + -1;
                              } while (iVar16 != 0);
                              goto LAB_001df4c1;
                            }
                            if (uVar10 == 0x10) {
                              if (uVar9 == 0) {
                                iVar16 = 0xb;
                                uVar10 = 0;
                                local_124 = 0x36;
                              }
                              else {
                                local_120.bp = local_120.bp + 2;
                                puVar11 = local_e0 + ((uVar9 - 0x102) + (int)local_d0);
                                if (uVar9 < local_d4) {
                                  puVar11 = local_e8 + (uVar9 - 1);
                                }
                                uVar10 = *puVar11;
                                uVar17 = uVar17 & 0xffffffff;
                                puVar11 = local_e8 + uVar17;
                                iVar16 = (local_120.buffer & 3) + 3;
                                do {
                                  if (uVar19 <= uVar17) {
                                    local_124 = 0xd;
                                    break;
                                  }
                                  puVar12 = local_e0 + (uint)((int)uVar17 + iVar18);
                                  if (uVar17 < uVar21) {
                                    puVar12 = puVar11;
                                  }
                                  *puVar12 = uVar10;
                                  uVar17 = uVar17 + 1;
                                  puVar11 = puVar11 + 1;
                                  iVar16 = iVar16 + -1;
                                } while (iVar16 != 0);
                                uVar10 = (uint)uVar17;
                                iVar16 = 0;
                                local_120.buffer = local_120.buffer >> 2;
                              }
                              uVar17 = (ulong)uVar10;
                              if (uVar9 != 0) goto LAB_001df4c1;
                            }
                            else {
                              iVar16 = 0xb;
                              local_124 = 0x10;
                            }
                          }
                        } while (iVar16 == 0);
                        puVar11 = local_e8;
                        out = local_f8;
                        puVar12 = local_e0;
                        if (local_124 == 0) {
                          if (local_e8[0x100] == 0) {
                            local_124 = 0x40;
                          }
                          else {
                            local_124 = HuffmanTree_makeFromLengths(&local_88,local_e8,0x120,0xf);
                            puVar12 = local_e0;
                            if (local_124 == 0) {
                              local_124 = HuffmanTree_makeFromLengths(&local_b8,local_e0,0x20,0xf);
                            }
                          }
                        }
                      }
                    }
                    free(bitlen);
                    free(puVar11);
                    free(puVar12);
                    HuffmanTree_cleanup(&local_58);
                  }
                }
              }
              bVar5 = false;
              do {
                if (local_124 != 0 || bVar5) break;
                uVar17 = local_120.bp >> 3;
                if (uVar17 + 4 < local_120.size) {
                  bVar14 = (byte)local_120.bp & 7;
                  local_120.buffer =
                       ((uint)local_120.data[uVar17 + 4] << 0x18) << (8 - bVar14 & 0x1f) |
                       *(uint *)(local_120.data + uVar17) >> bVar14;
                }
                else {
                  local_120.buffer = 0;
                  if (uVar17 < local_120.size) {
                    local_120.buffer = (uint)local_120.data[uVar17];
                  }
                  if (uVar17 + 1 < local_120.size) {
                    local_120.buffer = local_120.buffer | (uint)local_120.data[uVar17 + 1] << 8;
                  }
                  if (uVar17 + 2 < local_120.size) {
                    local_120.buffer = local_120.buffer | (uint)local_120.data[uVar17 + 2] << 0x10;
                  }
                  if (uVar17 + 3 < local_120.size) {
                    local_120.buffer = local_120.buffer | (uint)local_120.data[uVar17 + 3] << 0x18;
                  }
                  local_120.buffer = local_120.buffer >> ((byte)local_120.bp & 7);
                }
                uVar20 = huffmanDecodeSymbol(&local_120,&local_88);
                if (uVar20 < 0x100) {
                  sVar3 = out->size;
                  out->size = sVar3 + 1;
                  out->data[sVar3] = (uchar)uVar20;
                  uVar20 = huffmanDecodeSymbol(&local_120,&local_88);
                }
                bVar6 = bVar5;
                if (uVar20 < 0x100) {
                  sVar3 = out->size;
                  out->size = sVar3 + 1;
                  out->data[sVar3] = (uchar)uVar20;
LAB_001def61:
                  bVar5 = bVar6;
                  if ((out->allocsize - out->size < 0x104) &&
                     (uVar20 = ucvector_reserve(out,out->size + 0x104), uVar20 == 0)) {
                    local_124 = 0x53;
                    iVar18 = 3;
                  }
                  else {
                    iVar18 = 3;
                    if (local_120.bitsize < local_120.bp) {
                      local_124 = 0x33;
                    }
                    else if ((local_c0 == 0) || (out->size <= local_c0)) {
                      iVar18 = 0;
                    }
                    else {
                      local_124 = 0x6d;
                    }
                  }
                }
                else if (uVar20 < 0x11e && uVar20 != 0x100) {
                  uVar17 = (ulong)(uVar20 - 0x101);
                  uVar21 = (ulong)LENGTHBASE[uVar17];
                  if (0xffffffffffffffeb < uVar17 - 0x1c) {
                    uVar19 = local_120.bp >> 3;
                    if (uVar19 + 3 < local_120.size) {
                      local_120.buffer = *(uint *)(local_120.data + uVar19);
                    }
                    else {
                      local_120.buffer = 0;
                      if (uVar19 < local_120.size) {
                        local_120.buffer = (uint)local_120.data[uVar19];
                      }
                      if (uVar19 + 1 < local_120.size) {
                        local_120.buffer = local_120.buffer | (uint)local_120.data[uVar19 + 1] << 8;
                      }
                      if (uVar19 + 2 < local_120.size) {
                        local_120.buffer =
                             local_120.buffer | (uint)local_120.data[uVar19 + 2] << 0x10;
                      }
                    }
                    bVar14 = (byte)local_120.bp;
                    local_120.bp = local_120.bp + LENGTHEXTRA[uVar17];
                    uVar21 = uVar21 + (~(-1 << ((byte)LENGTHEXTRA[uVar17] & 0x1f)) &
                                      local_120.buffer >> (bVar14 & 7));
                  }
                  uVar17 = local_120.bp >> 3;
                  if (uVar17 + 4 < local_120.size) {
                    bVar14 = (byte)local_120.bp & 7;
                    local_120.buffer =
                         ((uint)local_120.data[uVar17 + 4] << 0x18) << (8 - bVar14 & 0x1f) |
                         *(uint *)(local_120.data + uVar17) >> bVar14;
                  }
                  else {
                    local_120.buffer = 0;
                    if (uVar17 < local_120.size) {
                      local_120.buffer = (uint)local_120.data[uVar17];
                    }
                    if (uVar17 + 1 < local_120.size) {
                      local_120.buffer = local_120.buffer | (uint)local_120.data[uVar17 + 1] << 8;
                    }
                    if (uVar17 + 2 < local_120.size) {
                      local_120.buffer = local_120.buffer | (uint)local_120.data[uVar17 + 2] << 0x10
                      ;
                    }
                    if (uVar17 + 3 < local_120.size) {
                      local_120.buffer = local_120.buffer | (uint)local_120.data[uVar17 + 3] << 0x18
                      ;
                    }
                    local_120.buffer = local_120.buffer >> ((byte)local_120.bp & 7);
                  }
                  uVar20 = huffmanDecodeSymbol(&local_120,&local_b8);
                  puVar26 = local_f8;
                  if (uVar20 < 0x1e) {
                    uVar9 = DISTANCEBASE[uVar20];
                    if (3 < uVar20) {
                      bVar14 = (byte)DISTANCEEXTRA[uVar20];
                      uVar10 = ~(-1 << (bVar14 & 0x1f)) & local_120.buffer;
                      local_120.buffer = local_120.buffer >> (bVar14 & 0x1f);
                      local_120.bp = local_120.bp + DISTANCEEXTRA[uVar20];
                      uVar9 = uVar9 + uVar10;
                    }
                    uVar17 = out->size;
                    uVar19 = (ulong)uVar9;
                    lVar23 = uVar17 - uVar19;
                    if (uVar17 < uVar19) {
                      local_124 = 0x34;
                      iVar18 = 3;
                      bVar4 = false;
                      puVar26 = out;
                    }
                    else {
                      out->size = uVar17 + uVar21;
                      lVar24 = uVar21 - uVar19;
                      if (uVar21 < uVar19 || lVar24 == 0) {
                        iVar18 = 0;
                        bVar4 = true;
                        if (uVar21 != 0) {
                          memcpy(local_f8->data + uVar17,local_f8->data + lVar23,uVar21);
                        }
                      }
                      else {
                        if (uVar19 != 0) {
                          memcpy(local_f8->data + uVar17,local_f8->data + lVar23,uVar19);
                        }
                        lVar25 = uVar17 + uVar19;
                        do {
                          puVar1 = local_f8->data + lVar23;
                          lVar23 = lVar23 + 1;
                          local_f8->data[lVar25] = *puVar1;
                          lVar25 = lVar25 + 1;
                          lVar24 = lVar24 + -1;
                        } while (lVar24 != 0);
                        iVar18 = 0;
                        bVar4 = true;
                        puVar26 = local_f8;
                      }
                    }
                  }
                  else {
                    local_124 = (uint)(uVar20 < 0x20) * 2 + 0x10;
                    iVar18 = 3;
                    bVar4 = false;
                    puVar26 = out;
                  }
                  out = puVar26;
                  if (bVar4) goto LAB_001def61;
                }
                else {
                  bVar6 = true;
                  if (uVar20 == 0x100) goto LAB_001def61;
                  local_124 = 0x10;
                  iVar18 = 3;
                }
              } while (iVar18 == 0);
              HuffmanTree_cleanup(&local_88);
              HuffmanTree_cleanup(&local_b8);
              settings = local_c8;
            }
          }
          if (local_124 == 0) {
            if (settings->max_output_size == 0) {
              local_124 = 0;
            }
            else {
              local_124 = 0;
              if (settings->max_output_size < local_f8->size) {
                local_124 = 0x6d;
              }
            }
          }
          cVar8 = (local_124 != 0) * '\x03';
          out = local_f8;
        }
      }
    } while (cVar8 == '\0');
    if (cVar8 == '\x03') {
LAB_001df71b:
      local_ec = local_124;
    }
  }
  return local_ec;
}

Assistant:

static unsigned lodepng_inflatev(ucvector* out,
                                 const unsigned char* in, size_t insize,
                                 const LodePNGDecompressSettings* settings) {
  unsigned BFINAL = 0;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, in, insize);

  if(error) return error;

  while(!BFINAL) {
    unsigned BTYPE;
    if(reader.bitsize - reader.bp < 3) return 52; /*error, bit pointer will jump past memory*/
    ensureBits9(&reader, 3);
    BFINAL = readBits(&reader, 1);
    BTYPE = readBits(&reader, 2);

    if(BTYPE == 3) return 20; /*error: invalid BTYPE*/
    else if(BTYPE == 0) error = inflateNoCompression(out, &reader, settings); /*no compression*/
    else error = inflateHuffmanBlock(out, &reader, BTYPE, settings->max_output_size); /*compression, BTYPE 01 or 10*/
    if(!error && settings->max_output_size && out->size > settings->max_output_size) error = 109;
    if(error) break;
  }

  return error;
}